

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBasicDrawTests.cpp
# Opt level: O0

void __thiscall
vkt::Draw::anon_unknown_0::DrawTestInstance<vkt::Draw::(anonymous_namespace)::DrawIndirectParams>::
~DrawTestInstance(DrawTestInstance<vkt::Draw::(anonymous_namespace)::DrawIndirectParams> *this)

{
  DrawTestInstance<vkt::Draw::(anonymous_namespace)::DrawIndirectParams> *this_local;
  
  (this->super_DrawTestInstanceBase).super_TestInstance._vptr_TestInstance =
       (_func_int **)&PTR__DrawTestInstance_0166ae48;
  DrawIndirectParams::~DrawIndirectParams(&this->m_data);
  DrawTestInstanceBase::~DrawTestInstanceBase(&this->super_DrawTestInstanceBase);
  return;
}

Assistant:

DrawTestInstance<T>::~DrawTestInstance (void)
{
}